

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O0

bool __thiscall
ObjectModelBuilder::buildFunction(ObjectModelBuilder *this,string *functionString,Class *clazz)

{
  string *__return_storage_ptr__;
  ostream *poVar1;
  undefined1 local_68 [8];
  Function f;
  string function;
  Class *clazz_local;
  string *functionString_local;
  ObjectModelBuilder *this_local;
  
  __return_storage_ptr__ = (string *)(f.signature.field_2._M_local_buf + 8);
  string_trim(__return_storage_ptr__,functionString);
  Function::Function((Function *)local_68);
  local_68 = (undefined1  [8])clazz;
  std::__cxx11::string::operator=((string *)&f,(string *)__return_storage_ptr__);
  std::vector<Function,_std::allocator<Function>_>::push_back
            (&clazz->functions,(value_type *)local_68);
  if ((this->m_verbose & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr," - function: \'");
    poVar1 = std::operator<<(poVar1,(string *)(f.signature.field_2._M_local_buf + 8));
    poVar1 = std::operator<<(poVar1,"\'");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  Function::~Function((Function *)local_68);
  std::__cxx11::string::~string((string *)(f.signature.field_2._M_local_buf + 8));
  return true;
}

Assistant:

bool ObjectModelBuilder::buildFunction(const std::string &functionString, Class *clazz)
{
    std::string function = string_trim(functionString);

    Function f;
    f.clazz = clazz;
    f.signature = function;
    clazz->functions.push_back(f);

    if (m_verbose)
        std::cerr << " - function: '" << function << "'" << std::endl;

    return true;
}